

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall QArrayDataPointer<char>::clear(QArrayDataPointer<char> *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = this->d;
  local_28.ptr = this->ptr;
  this->d = (Data *)0x0;
  this->ptr = (char *)0x0;
  local_28.size = this->size;
  this->size = 0;
  ~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() noexcept(std::is_nothrow_destructible<T>::value)
    {
        QArrayDataPointer tmp;
        swap(tmp);
    }